

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

nvpair_t * nvpair_move_nvlist(char *name,nvlist_t *value)

{
  int iVar1;
  nvpair_t *pnVar2;
  int *piVar3;
  nvpair_t *nvp;
  nvlist_t *value_local;
  char *name_local;
  
  if ((value == (nvlist_t *)0x0) ||
     (pnVar2 = nvlist_get_nvpair_parent(value), pnVar2 != (nvpair_t *)0x0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    name_local = (char *)0x0;
  }
  else {
    iVar1 = nvlist_error(value);
    if (iVar1 == 0) {
      name_local = (char *)nvpair_allocv(name,5,(uint64_t)value,0,0);
      if ((nvpair_t *)name_local == (nvpair_t *)0x0) {
        nvlist_destroy(value);
      }
      else {
        nvlist_set_parent(value,(nvpair_t *)name_local);
      }
    }
    else {
      iVar1 = nvlist_error(value);
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      nvlist_destroy(value);
      name_local = (char *)0x0;
    }
  }
  return (nvpair_t *)name_local;
}

Assistant:

nvpair_t *
nvpair_move_nvlist(const char *name, nvlist_t *value)
{
	nvpair_t *nvp;

	if (value == NULL || nvlist_get_nvpair_parent(value) != NULL) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if (nvlist_error(value) != 0) {
		ERRNO_SET(nvlist_error(value));
		nvlist_destroy(value);
		return (NULL);
	}

	nvp = nvpair_allocv(name, NV_TYPE_NVLIST, (uint64_t)(uintptr_t)value,
	    0, 0);
	if (nvp == NULL)
		nvlist_destroy(value);
	else
		nvlist_set_parent(value, nvp);

	return (nvp);
}